

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontNonSym.cpp
# Opt level: O2

void __thiscall
TPZFrontNonSym<double>::ExtractFrontMatrix(TPZFrontNonSym<double> *this,TPZFMatrix<double> *front)

{
  double dVar1;
  long lVar2;
  long *plVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  double *pdVar7;
  long lVar8;
  long lVar9;
  int64_t global;
  
  lVar2 = (this->super_TPZFront<double>).fLocal.fNElements;
  for (global = (this->super_TPZFront<double>).fNextRigidBodyMode; global < lVar2;
      global = global + 1) {
    iVar5 = Local(this,global);
    (this->super_TPZFront<double>).fData.fStore
    [(long)(this->super_TPZFront<double>).fMaxFront * (long)iVar5 + (long)iVar5] = 1.0;
  }
  lVar6 = 0;
  lVar9 = 0;
  if (0 < lVar2) {
    lVar9 = lVar2;
  }
  for (; (lVar8 = lVar9, lVar9 != lVar6 &&
         (lVar8 = lVar6, (this->super_TPZFront<double>).fLocal.fStore[lVar6] == -1));
      lVar6 = lVar6 + 1) {
  }
  (*(front->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
            (front,lVar2 - lVar8);
  for (lVar9 = lVar8; lVar9 < lVar2; lVar9 = lVar9 + 1) {
    if ((this->super_TPZFront<double>).fLocal.fStore[lVar9] != -1) {
      for (lVar6 = 0; lVar2 != lVar6; lVar6 = lVar6 + 1) {
        plVar3 = (this->super_TPZFront<double>).fLocal.fStore;
        lVar4 = plVar3[lVar6];
        if (lVar4 != -1) {
          dVar1 = (this->super_TPZFront<double>).fData.fStore
                  [lVar4 * (this->super_TPZFront<double>).fMaxFront + plVar3[lVar9]];
          pdVar7 = TPZFMatrix<double>::operator()(front,lVar9 - lVar8,lVar6 - lVar8);
          *pdVar7 = dVar1;
        }
      }
    }
  }
  return;
}

Assistant:

void TPZFrontNonSym<TVar>::ExtractFrontMatrix(TPZFMatrix<TVar> &front)
{
	// Extend the front with the non initialized rigid body modes
	int64_t ieq;
	int64_t maxeq = this->fLocal.NElements();
	for (ieq = this->fNextRigidBodyMode; ieq< maxeq; ieq++) {
		int ilocal = Local(ieq);
		Element(ilocal, ilocal) = 1.;
	}
	
	int64_t mineq = 0;
	for(mineq=0; mineq<maxeq; mineq++) if(this->fLocal[mineq] != -1) break;
	int64_t numeq = maxeq-mineq;
	front.Redim(numeq,numeq);
	int64_t jeq;
	for(ieq=mineq;ieq<maxeq;ieq++) {
		if(this->fLocal[ieq] == -1) continue;
		int64_t il = ieq-mineq;
		for(jeq=0;jeq<maxeq;jeq++) {
			if(this->fLocal[jeq] == -1) continue;
			int64_t jl = jeq-mineq;
			front(il,jl) = this->Element(this->fLocal[ieq],this->fLocal[jeq]);
		}
	}
	
}